

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_reflect_float(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = c->in[0].m_data[2];
  fVar2 = c->in[1].m_data[0];
  fVar3 = fVar2 * fVar1 + 0.0;
  (c->color).m_data[0] = fVar1 - (fVar3 + fVar3) * fVar2;
  return;
}

Assistant:

Vector<T, 1>			swizzle		(int a) const { DE_ASSERT(a >= 0 && a < Size); return Vector<T, 1>(m_data[a]); }